

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register_pressure.cpp
# Opt level: O2

void __thiscall
spvtools::opt::RegisterLiveness::SimulateFusion
          (RegisterLiveness *this,Loop *l1,Loop *l2,RegionRegisterLiveness *sim_result)

{
  _Hash_node_base _Var1;
  Instruction *pIVar2;
  FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ValveSoftware[P]Fossilize_cli_SPIRV_Tools_source_opt_register_pressure_cpp:385:7)>
  __first;
  FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ValveSoftware[P]Fossilize_cli_SPIRV_Tools_source_opt_register_pressure_cpp:385:7)>
  __first_00;
  FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ValveSoftware[P]Fossilize_cli_SPIRV_Tools_source_opt_register_pressure_cpp:385:7)>
  __last;
  FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ValveSoftware[P]Fossilize_cli_SPIRV_Tools_source_opt_register_pressure_cpp:385:7)>
  __last_00;
  Loop *pLVar3;
  bool bVar4;
  uint32_t uVar5;
  RegionRegisterLiveness *pRVar6;
  size_type sVar7;
  CFG *pCVar8;
  BasicBlock *pBVar9;
  ulong uVar10;
  Loop *in_R9;
  Instruction *insn_1;
  __node_base _Var11;
  __node_base *p_Var12;
  __node_base *p_Var13;
  Instruction *insn;
  anon_class_16_2_f9f0633a_for_predicate_ predicate;
  anon_class_16_2_f9f0633a_for_predicate_ predicate_00;
  Range live_loop;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  seen_insn;
  LiveSet live_out_1;
  LiveSet l1_latch_live_out;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  exit_blocks;
  uint32_t local_15c;
  Loop *local_158;
  FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ValveSoftware[P]Fossilize_cli_SPIRV_Tools_source_opt_register_pressure_cpp:385:7)>
  local_150;
  FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ValveSoftware[P]Fossilize_cli_SPIRV_Tools_source_opt_register_pressure_cpp:385:7)>
  local_130;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_110;
  _Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_d8;
  _Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_a0;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_68;
  
  RegionRegisterLiveness::Clear(sim_result);
  pRVar6 = Get(this,l1->loop_header_);
  std::
  _Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::operator=((_Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
               *)sim_result,
              (_Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
               *)pRVar6);
  pRVar6 = Get(this,l2->loop_header_);
  std::__detail::
  _Insert_base<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::insert<std::__detail::_Node_const_iterator<spvtools::opt::Instruction*,true,false>>
            ((_Insert_base<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)sim_result,
             (_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false>)
             (pRVar6->live_in_)._M_h._M_before_begin._M_nxt,
             (_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false>)0x0);
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  local_158 = l2;
  Loop::GetExitBlocks(l2,(unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                          *)&local_68);
  for (_Var11._M_nxt = local_68._M_before_begin._M_nxt; _Var11._M_nxt != (_Hash_node_base *)0x0;
      _Var11._M_nxt = (_Var11._M_nxt)->_M_nxt) {
    pRVar6 = Get(this,*(uint32_t *)&_Var11._M_nxt[1]._M_nxt);
    std::__detail::
    _Insert_base<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::insert<std::__detail::_Node_const_iterator<spvtools::opt::Instruction*,true,false>>
              ((_Insert_base<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)&sim_result->live_out_,
               (_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false>)
               (pRVar6->live_in_)._M_h._M_before_begin._M_nxt,
               (_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false>)0x0);
  }
  local_110._M_buckets = &local_110._M_single_bucket;
  local_110._M_bucket_count = 1;
  local_110._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_110._M_element_count = 0;
  local_110._M_rehash_policy._M_max_load_factor = 1.0;
  local_110._M_rehash_policy._M_next_resize = 0;
  local_110._M_single_bucket = (__node_base_ptr)0x0;
  p_Var12 = &(sim_result->live_out_)._M_h._M_before_begin;
  while (p_Var12 = p_Var12->_M_nxt, p_Var12 != (__node_base *)0x0) {
    _Var1._M_nxt = p_Var12[1]._M_nxt;
    RegionRegisterLiveness::AddRegisterClass(sim_result,(Instruction *)_Var1._M_nxt);
    local_150.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur._0_4_ =
         Instruction::result_id((Instruction *)_Var1._M_nxt);
    std::__detail::
    _Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
    ::insert((_Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
              *)&local_110,(value_type *)&local_150);
  }
  p_Var12 = &(sim_result->live_in_)._M_h._M_before_begin;
  while (pLVar3 = local_158, p_Var12 = p_Var12->_M_nxt, p_Var12 != (__node_base *)0x0) {
    _Var1._M_nxt = p_Var12[1]._M_nxt;
    local_150.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur._0_4_ =
         Instruction::result_id((Instruction *)_Var1._M_nxt);
    sVar7 = std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::count(&local_110,(key_type_conflict *)&local_150);
    if (sVar7 != 0) {
      RegionRegisterLiveness::AddRegisterClass(sim_result,(Instruction *)_Var1._M_nxt);
      local_150.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur._0_4_ =
           Instruction::result_id((Instruction *)_Var1._M_nxt);
      std::__detail::
      _Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
      ::insert((_Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
                *)&local_110,(value_type *)&local_150);
    }
  }
  sim_result->used_registers_ = 0;
  local_a0._M_buckets = &((sim_result->live_in_)._M_h._M_before_begin._M_nxt)->_M_nxt;
  local_d8._M_buckets = (__buckets_ptr)0x0;
  predicate.l2 = in_R9;
  predicate.l1 = local_158;
  MakeFilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction*,true,false>,spvtools::opt::RegisterLiveness::SimulateFusion(spvtools::opt::Loop_const&,spvtools::opt::Loop_const&,spvtools::opt::RegisterLiveness::RegionRegisterLiveness*)const::__0>
            (&local_150,(opt *)&local_a0,
             (_Node_iterator<spvtools::opt::Instruction_*,_true,_false> *)&local_d8,
             (_Node_iterator<spvtools::opt::Instruction_*,_true,_false> *)l1,predicate);
  predicate_00.l2 = in_R9;
  predicate_00.l1 = pLVar3;
  MakeFilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction*,true,false>,spvtools::opt::RegisterLiveness::SimulateFusion(spvtools::opt::Loop_const&,spvtools::opt::Loop_const&,spvtools::opt::RegisterLiveness::RegionRegisterLiveness*)const::__0>
            (&local_130,(opt *)&local_d8,
             (_Node_iterator<spvtools::opt::Instruction_*,_true,_false> *)&local_d8,
             (_Node_iterator<spvtools::opt::Instruction_*,_true,_false> *)l1,predicate_00);
  p_Var13 = &(l1->loop_basic_blocks_)._M_h._M_before_begin;
  while( true ) {
    p_Var13 = p_Var13->_M_nxt;
    if (p_Var13 == (__node_base *)0x0) {
      uVar5 = BasicBlock::id(l1->loop_latch_);
      pRVar6 = Get(this,uVar5);
      if (pRVar6 == (RegionRegisterLiveness *)0x0) {
        __assert_fail("l1_latch_live_inout_info != nullptr && \"Basic block not processed\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/register_pressure.cpp"
                      ,0x19f,
                      "void spvtools::opt::RegisterLiveness::SimulateFusion(const Loop &, const Loop &, RegionRegisterLiveness *) const"
                     );
      }
      std::
      _Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::_Hashtable(&local_a0,&(pRVar6->live_out_)._M_h);
      __first_00.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur._4_4_ =
           local_150.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur.
           _4_4_;
      __first_00.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur._0_4_ =
           (uint32_t)
           local_150.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
      __first_00.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
           local_150.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
      __first_00.predicate_.l1 = local_150.predicate_.l1;
      __first_00.predicate_.l2 = local_150.predicate_.l2;
      __last_00.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
           local_130.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
      __last_00.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
           local_130.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
      __last_00.predicate_.l1 = local_130.predicate_.l1;
      __last_00.predicate_.l2 = local_130.predicate_.l2;
      std::
      unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>
      ::
      insert<spvtools::opt::FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction*,true,false>,spvtools::opt::RegisterLiveness::SimulateFusion(spvtools::opt::Loop_const&,spvtools::opt::Loop_const&,spvtools::opt::RegisterLiveness::RegionRegisterLiveness*)const::__0>>
                ((unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>
                  *)&local_a0,__first_00,__last_00);
      p_Var13 = &(local_158->loop_basic_blocks_)._M_h._M_before_begin;
      while( true ) {
        p_Var13 = p_Var13->_M_nxt;
        if (p_Var13 == (__node_base *)0x0) {
          std::
          _Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::~_Hashtable(&local_a0);
          std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::~_Hashtable(&local_110);
          std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::~_Hashtable(&local_68);
          return;
        }
        sVar7 = *(size_type *)(p_Var13 + 1);
        pCVar8 = IRContext::cfg(this->context_);
        pBVar9 = CFG::block(pCVar8,(uint32_t)sVar7);
        pRVar6 = Get(this,(uint32_t)sVar7);
        if (pRVar6 == (RegionRegisterLiveness *)0x0) break;
        std::
        _Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::_Hashtable(&local_d8,&(pRVar6->live_out_)._M_h);
        std::__detail::
        _Insert_base<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::insert<std::__detail::_Node_iterator<spvtools::opt::Instruction*,true,false>>
                  ((_Insert_base<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)&local_d8,
                   (_Node_iterator<spvtools::opt::Instruction_*,_true,_false>)
                   local_a0._M_before_begin._M_nxt,
                   (_Node_iterator<spvtools::opt::Instruction_*,_true,_false>)0x0);
        uVar10 = (local_d8._M_element_count + pRVar6->used_registers_) -
                 (pRVar6->live_out_)._M_h._M_element_count;
        if (uVar10 < sim_result->used_registers_) {
          uVar10 = sim_result->used_registers_;
        }
        sim_result->used_registers_ = uVar10;
        pIVar2 = &(pBVar9->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
        while (pIVar2 = *(Instruction **)
                         ((long)&pIVar2->super_IntrusiveNodeBase<spvtools::opt::Instruction> + 8),
              pIVar2 != &(pBVar9->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_)
        {
          if ((pIVar2->opcode_ != OpPhi) &&
             (bVar4 = anon_unknown_8::CreatesRegisterUsage(pIVar2), bVar4)) {
            local_15c = Instruction::result_id(pIVar2);
            sVar7 = std::
                    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    ::count(&local_110,&local_15c);
            if (sVar7 == 0) {
              RegionRegisterLiveness::AddRegisterClass(sim_result,pIVar2);
            }
          }
        }
        std::
        _Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable(&local_d8);
      }
      __assert_fail("live_inout_info != nullptr && \"Basic block not processed\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/register_pressure.cpp"
                    ,0x1ab,
                    "void spvtools::opt::RegisterLiveness::SimulateFusion(const Loop &, const Loop &, RegionRegisterLiveness *) const"
                   );
    }
    sVar7 = *(size_type *)(p_Var13 + 1);
    pCVar8 = IRContext::cfg(this->context_);
    pBVar9 = CFG::block(pCVar8,(uint32_t)sVar7);
    pRVar6 = Get(this,(uint32_t)sVar7);
    if (pRVar6 == (RegionRegisterLiveness *)0x0) break;
    std::
    _Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::_Hashtable(&local_a0,&(pRVar6->live_out_)._M_h);
    __first.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur._4_4_ =
         local_150.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur._4_4_;
    __first.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur._0_4_ =
         (uint32_t)
         local_150.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
    __first.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
         local_150.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
    __first.predicate_.l1 = local_150.predicate_.l1;
    __first.predicate_.l2 = local_150.predicate_.l2;
    __last.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
         local_130.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
    __last.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
         local_130.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
    __last.predicate_.l1 = local_130.predicate_.l1;
    __last.predicate_.l2 = local_130.predicate_.l2;
    std::
    unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>
    ::
    insert<spvtools::opt::FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction*,true,false>,spvtools::opt::RegisterLiveness::SimulateFusion(spvtools::opt::Loop_const&,spvtools::opt::Loop_const&,spvtools::opt::RegisterLiveness::RegionRegisterLiveness*)const::__0>>
              ((unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>
                *)&local_a0,__first,__last);
    uVar10 = (local_a0._M_element_count + pRVar6->used_registers_) -
             (pRVar6->live_out_)._M_h._M_element_count;
    if (uVar10 < sim_result->used_registers_) {
      uVar10 = sim_result->used_registers_;
    }
    sim_result->used_registers_ = uVar10;
    pIVar2 = &(pBVar9->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
    while (pIVar2 = *(Instruction **)
                     ((long)&pIVar2->super_IntrusiveNodeBase<spvtools::opt::Instruction> + 8),
          pIVar2 != &(pBVar9->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_) {
      if ((pIVar2->opcode_ != OpPhi) &&
         (bVar4 = anon_unknown_8::CreatesRegisterUsage(pIVar2), bVar4)) {
        uVar5 = Instruction::result_id(pIVar2);
        local_d8._M_buckets = (__buckets_ptr)CONCAT44(local_d8._M_buckets._4_4_,uVar5);
        sVar7 = std::
                _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::count(&local_110,(key_type_conflict *)&local_d8);
        if (sVar7 == 0) {
          RegionRegisterLiveness::AddRegisterClass(sim_result,pIVar2);
        }
      }
    }
    std::
    _Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&local_a0);
  }
  __assert_fail("live_inout_info != nullptr && \"Basic block not processed\"",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/register_pressure.cpp"
                ,0x18c,
                "void spvtools::opt::RegisterLiveness::SimulateFusion(const Loop &, const Loop &, RegionRegisterLiveness *) const"
               );
}

Assistant:

void RegisterLiveness::SimulateFusion(
    const Loop& l1, const Loop& l2, RegionRegisterLiveness* sim_result) const {
  sim_result->Clear();

  // Compute the live-in state:
  //   sim_result.live_in = l1.live_in U l2.live_in
  // This assumes that |l1| does not generated register that is live-out for
  // |l1|.
  const RegionRegisterLiveness* l1_header_live_inout = Get(l1.GetHeaderBlock());
  sim_result->live_in_ = l1_header_live_inout->live_in_;

  const RegionRegisterLiveness* l2_header_live_inout = Get(l2.GetHeaderBlock());
  sim_result->live_in_.insert(l2_header_live_inout->live_in_.begin(),
                              l2_header_live_inout->live_in_.end());

  // The live-out set of the fused loop is the l2 live-out set.
  std::unordered_set<uint32_t> exit_blocks;
  l2.GetExitBlocks(&exit_blocks);

  for (uint32_t bb_id : exit_blocks) {
    const RegionRegisterLiveness* live_inout = Get(bb_id);
    sim_result->live_out_.insert(live_inout->live_in_.begin(),
                                 live_inout->live_in_.end());
  }

  // Compute the register usage information.
  std::unordered_set<uint32_t> seen_insn;
  for (Instruction* insn : sim_result->live_out_) {
    sim_result->AddRegisterClass(insn);
    seen_insn.insert(insn->result_id());
  }
  for (Instruction* insn : sim_result->live_in_) {
    if (!seen_insn.count(insn->result_id())) {
      continue;
    }
    sim_result->AddRegisterClass(insn);
    seen_insn.insert(insn->result_id());
  }

  sim_result->used_registers_ = 0;

  // The loop fusion is injecting the l1 before the l2, the latch of l1 will be
  // connected to the header of l2.
  // To compute the register usage, we inject the loop live-in (union of l1 and
  // l2 live-in header blocks) into the live in/out of each basic block of
  // l1 to get the peak register usage. We then repeat the operation to for l2
  // basic blocks but in this case we inject the live-out of the latch of l1.
  auto live_loop = MakeFilterIteratorRange(
      sim_result->live_in_.begin(), sim_result->live_in_.end(),
      [&l1, &l2](Instruction* insn) {
        BasicBlock* bb = insn->context()->get_instr_block(insn);
        return insn->HasResultId() &&
               !(insn->opcode() == spv::Op::OpPhi &&
                 (bb == l1.GetHeaderBlock() || bb == l2.GetHeaderBlock()));
      });

  for (uint32_t bb_id : l1.GetBlocks()) {
    BasicBlock* bb = context_->cfg()->block(bb_id);

    const RegionRegisterLiveness* live_inout_info = Get(bb_id);
    assert(live_inout_info != nullptr && "Basic block not processed");
    RegionRegisterLiveness::LiveSet live_out = live_inout_info->live_out_;
    live_out.insert(live_loop.begin(), live_loop.end());
    sim_result->used_registers_ =
        std::max(sim_result->used_registers_,
                 live_inout_info->used_registers_ + live_out.size() -
                     live_inout_info->live_out_.size());

    for (Instruction& insn : *bb) {
      if (insn.opcode() == spv::Op::OpPhi || !CreatesRegisterUsage(&insn) ||
          seen_insn.count(insn.result_id())) {
        continue;
      }
      sim_result->AddRegisterClass(&insn);
    }
  }

  const RegionRegisterLiveness* l1_latch_live_inout_info =
      Get(l1.GetLatchBlock()->id());
  assert(l1_latch_live_inout_info != nullptr && "Basic block not processed");
  RegionRegisterLiveness::LiveSet l1_latch_live_out =
      l1_latch_live_inout_info->live_out_;
  l1_latch_live_out.insert(live_loop.begin(), live_loop.end());

  auto live_loop_l2 =
      make_range(l1_latch_live_out.begin(), l1_latch_live_out.end());

  for (uint32_t bb_id : l2.GetBlocks()) {
    BasicBlock* bb = context_->cfg()->block(bb_id);

    const RegionRegisterLiveness* live_inout_info = Get(bb_id);
    assert(live_inout_info != nullptr && "Basic block not processed");
    RegionRegisterLiveness::LiveSet live_out = live_inout_info->live_out_;
    live_out.insert(live_loop_l2.begin(), live_loop_l2.end());
    sim_result->used_registers_ =
        std::max(sim_result->used_registers_,
                 live_inout_info->used_registers_ + live_out.size() -
                     live_inout_info->live_out_.size());

    for (Instruction& insn : *bb) {
      if (insn.opcode() == spv::Op::OpPhi || !CreatesRegisterUsage(&insn) ||
          seen_insn.count(insn.result_id())) {
        continue;
      }
      sim_result->AddRegisterClass(&insn);
    }
  }
}